

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void write_intra_prediction_modes(AV1_COMMON *cm,MACROBLOCKD *xd,int is_keyframe,aom_writer *w)

{
  byte bVar1;
  BLOCK_SIZE BVar2;
  uint8_t uVar3;
  ushort uVar4;
  ushort uVar5;
  aom_bit_depth_t aVar6;
  FRAME_CONTEXT *pFVar7;
  MB_MODE_INFO *pMVar8;
  MB_MODE_INFO *left_mi;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  aom_cdf_prob (*cdf) [14];
  int i;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  bool bVar17;
  int local_9c;
  uint8_t cache_color_found [16];
  int zero_count;
  int out_cache_colors [8];
  uint16_t color_cache [16];
  
  pFVar7 = xd->tile_ctx;
  pMVar8 = *xd->mi;
  bVar1 = pMVar8->mode;
  BVar2 = pMVar8->bsize;
  if (is_keyframe == 0) {
    cdf = pFVar7->y_mode_cdf + ""[BVar2];
  }
  else {
    left_mi = xd->left_mbmi;
    bVar9 = av1_above_block_mode(xd->above_mbmi);
    bVar10 = av1_left_block_mode(left_mi);
    cdf = pFVar7->kf_y_cdf[intra_mode_context[bVar9]] + intra_mode_context[bVar10];
  }
  aom_write_symbol(w,(uint)bVar1,*cdf,0xd);
  if ((BLOCK_8X4 < BVar2) && (0xf7 < (byte)(bVar1 - 9))) {
    write_angle_delta(w,(int)pMVar8->angle_delta[0],pFVar7->angle_delta_cdf[(ulong)bVar1 - 1]);
  }
  if ((cm->seq_params->monochrome == '\0') && (xd->is_chroma_ref == true)) {
    bVar9 = pMVar8->uv_mode;
    uVar13 = (ulong)(*xd->mi)->bsize;
    if (xd->lossless[*(ushort *)&(*xd->mi)->field_0xa7 & 7] == 0) {
      bVar17 = (0x2f0bffUL >> (uVar13 & 0x3f) & 1) != 0;
      if ((0x1f07ffUL >> (uVar13 & 0x3f) & 1) == 0) {
        bVar17 = false;
      }
    }
    else {
      bVar17 = av1_ss_size_lookup[uVar13][xd->plane[1].subsampling_x][xd->plane[1].subsampling_y] ==
               BLOCK_4X4;
    }
    aom_write_symbol(w,(uint)bVar9,pFVar7->uv_mode_cdf[bVar17][(uint)bVar1],
                     0xe - (uint)(bVar17 == false));
    if (bVar9 == 0xd) {
      bVar1 = pMVar8->cfl_alpha_idx;
      iVar16 = (int)pMVar8->cfl_alpha_signs;
      aom_write_symbol(w,iVar16,pFVar7->cfl_sign_cdf,8);
      uVar11 = (iVar16 + 1) * 0xb;
      iVar14 = (int)uVar11 >> 5;
      if (0x1f < uVar11) {
        aom_write_symbol(w,(uint)(bVar1 >> 4),pFVar7->cfl_sign_cdf + (long)iVar16 * 0x11 + -0x19,
                         0x10);
      }
      iVar16 = iVar14 * -3 + iVar16 + 1;
      if (iVar16 != 0) {
        aom_write_symbol(w,bVar1 & 0xf,pFVar7->cfl_alpha_cdf[iVar16 * 3 + iVar14 + -3],0x10);
      }
    }
    if ((BLOCK_8X4 < BVar2) && (0xf7 < (byte)(get_uv_mode_uv2y[bVar9] - 9))) {
      write_angle_delta(w,(int)pMVar8->angle_delta[1],
                        pFVar7->angle_delta_cdf[(ulong)(byte)get_uv_mode_uv2y[bVar9] - 1]);
    }
  }
  if (((cm->features).allow_screen_content_tools != false) &&
     ((BLOCK_128X128 < BVar2 || ((0xe007U >> (BVar2 & 0x1f) & 1) == 0)))) {
    uVar3 = cm->seq_params->monochrome;
    bVar1 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[pMVar8->bsize];
    if (pMVar8->mode == '\0') {
      uVar11 = 0;
      if (xd->above_mbmi != (MB_MODE_INFO *)0x0) {
        uVar11 = (uint)((xd->above_mbmi->palette_mode_info).palette_size[0] != '\0');
      }
      bVar9 = (pMVar8->palette_mode_info).palette_size[0];
      if (xd->left_mbmi != (MB_MODE_INFO *)0x0) {
        uVar11 = (uVar11 + 1) - (uint)((xd->left_mbmi->palette_mode_info).palette_size[0] == '\0');
      }
      aom_write_symbol(w,(uint)(bVar9 != 0),
                       xd->tile_ctx->palette_y_mode_cdf[(ulong)bVar1 - 6][uVar11],2);
      if (bVar9 != 0) {
        aom_write_symbol(w,bVar9 - 2,xd->tile_ctx->palette_y_size_cdf[(ulong)bVar1 - 6],7);
        aVar6 = cm->seq_params->bit_depth;
        bVar9 = (pMVar8->palette_mode_info).palette_size[0];
        lVar15 = 0;
        iVar14 = av1_get_palette_cache(xd,0,color_cache);
        iVar16 = av1_index_color_cache
                           (color_cache,iVar14,(pMVar8->palette_mode_info).palette_colors,
                            (uint)bVar9,cache_color_found,out_cache_colors);
        for (uVar11 = 0; (lVar15 < iVar14 && (uVar11 < bVar9)); uVar11 = uVar11 + bVar10) {
          bVar10 = cache_color_found[lVar15];
          aom_write_bit(w,(uint)bVar10);
          lVar15 = lVar15 + 1;
        }
        delta_encode_palette_colors(out_cache_colors,iVar16,aVar6,1,w);
      }
    }
    if (((uVar3 == '\0') && (pMVar8->uv_mode == '\0')) && (xd->is_chroma_ref == true)) {
      bVar9 = (pMVar8->palette_mode_info).palette_size[1];
      aom_write_symbol(w,(uint)(bVar9 != 0),
                       xd->tile_ctx->palette_uv_mode_cdf
                       [(pMVar8->palette_mode_info).palette_size[0] != '\0'],2);
      if (bVar9 != 0) {
        aom_write_symbol(w,bVar9 - 2,xd->tile_ctx->palette_uv_size_cdf[(int)(bVar1 - 6)],7);
        aVar6 = cm->seq_params->bit_depth;
        bVar1 = (pMVar8->palette_mode_info).palette_size[1];
        iVar14 = av1_get_palette_cache(xd,1,color_cache);
        iVar16 = av1_index_color_cache
                           (color_cache,iVar14,(pMVar8->palette_mode_info).palette_colors + 8,
                            (uint)bVar1,cache_color_found,out_cache_colors);
        lVar15 = 0;
        for (uVar11 = 0; (lVar15 < iVar14 && (uVar11 < bVar1)); uVar11 = uVar11 + bVar9) {
          bVar9 = cache_color_found[lVar15];
          aom_write_bit(w,(uint)bVar9);
          lVar15 = lVar15 + 1;
        }
        delta_encode_palette_colors(out_cache_colors,iVar16,aVar6,0,w);
        zero_count = 0;
        local_9c = 0;
        iVar14 = av1_get_palette_delta_bits_v
                           (&pMVar8->palette_mode_info,aVar6,&zero_count,&local_9c);
        if ((int)((aVar6 - zero_count) + (bVar1 - 1) * (iVar14 + 1) + 2) < (int)(aVar6 * bVar1)) {
          aom_write_bit(w,1);
          aom_write_literal(w,iVar14 - local_9c,2);
          aom_write_literal(w,(uint)(pMVar8->palette_mode_info).palette_colors[0x10],aVar6);
          for (lVar15 = 0x40; lVar15 - 0x3fU < (ulong)(uint)bVar1; lVar15 = lVar15 + 1) {
            uVar4 = *(ushort *)((long)pMVar8->mv + lVar15 * 2 + -8);
            uVar5 = *(ushort *)((long)pMVar8->mv + lVar15 * 2 + -10);
            if (uVar4 == uVar5) {
              aom_write_literal(w,0,iVar14);
            }
            else {
              iVar12 = (uint)uVar4 - (uint)uVar5;
              iVar16 = -iVar12;
              if (0 < iVar12) {
                iVar16 = iVar12;
              }
              iVar12 = (1 << ((byte)aVar6 & 0x1f)) - iVar16;
              if (iVar12 < iVar16) {
                bVar17 = uVar5 <= uVar4;
                iVar16 = iVar12;
              }
              else {
                bVar17 = uVar4 < uVar5;
              }
              aom_write_literal(w,iVar16,iVar14);
              aom_write_bit(w,(uint)bVar17);
            }
          }
        }
        else {
          aom_write_bit(w,0);
          for (uVar13 = 0; bVar1 != uVar13; uVar13 = uVar13 + 1) {
            aom_write_literal(w,(uint)(pMVar8->palette_mode_info).palette_colors[uVar13 + 0x10],
                              aVar6);
          }
        }
      }
    }
  }
  if ((((pMVar8->mode == '\0') && ((pMVar8->palette_mode_info).palette_size[0] == '\0')) &&
      ((uVar13 = (ulong)pMVar8->bsize, uVar13 != 0xff &&
       (((cm->seq_params->enable_filter_intra != '\0' && ((0x1f07ffUL >> (uVar13 & 0x3f) & 1) != 0))
        && ((0x2f0bffUL >> (uVar13 & 0x3f) & 1) != 0)))))) &&
     (aom_write_symbol(w,(uint)(pMVar8->filter_intra_mode_info).use_filter_intra,
                       xd->tile_ctx->filter_intra_cdfs[uVar13],2),
     (pMVar8->filter_intra_mode_info).use_filter_intra != '\0')) {
    aom_write_symbol(w,(uint)(pMVar8->filter_intra_mode_info).filter_intra_mode,
                     xd->tile_ctx->filter_intra_mode_cdf,5);
  }
  return;
}

Assistant:

static inline void write_intra_prediction_modes(const AV1_COMMON *cm,
                                                MACROBLOCKD *const xd,
                                                int is_keyframe,
                                                aom_writer *w) {
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const PREDICTION_MODE mode = mbmi->mode;
  const BLOCK_SIZE bsize = mbmi->bsize;

  // Y mode.
  if (is_keyframe) {
    const MB_MODE_INFO *const above_mi = xd->above_mbmi;
    const MB_MODE_INFO *const left_mi = xd->left_mbmi;
    write_intra_y_mode_kf(ec_ctx, mbmi, above_mi, left_mi, mode, w);
  } else {
    write_intra_y_mode_nonkf(ec_ctx, bsize, mode, w);
  }

  // Y angle delta.
  const int use_angle_delta = av1_use_angle_delta(bsize);
  if (use_angle_delta && av1_is_directional_mode(mode)) {
    write_angle_delta(w, mbmi->angle_delta[PLANE_TYPE_Y],
                      ec_ctx->angle_delta_cdf[mode - V_PRED]);
  }

  // UV mode and UV angle delta.
  if (!cm->seq_params->monochrome && xd->is_chroma_ref) {
    const UV_PREDICTION_MODE uv_mode = mbmi->uv_mode;
    write_intra_uv_mode(ec_ctx, uv_mode, mode, is_cfl_allowed(xd), w);
    if (uv_mode == UV_CFL_PRED)
      write_cfl_alphas(ec_ctx, mbmi->cfl_alpha_idx, mbmi->cfl_alpha_signs, w);
    const PREDICTION_MODE intra_mode = get_uv_mode(uv_mode);
    if (use_angle_delta && av1_is_directional_mode(intra_mode)) {
      write_angle_delta(w, mbmi->angle_delta[PLANE_TYPE_UV],
                        ec_ctx->angle_delta_cdf[intra_mode - V_PRED]);
    }
  }

  // Palette.
  if (av1_allow_palette(cm->features.allow_screen_content_tools, bsize)) {
    write_palette_mode_info(cm, xd, mbmi, w);
  }

  // Filter intra.
  write_filter_intra_mode_info(cm, xd, mbmi, w);
}